

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::StrictEqualNumberType
               (Var aLeft,Var aRight,TypeId leftType,TypeId rightType,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  JavascriptTypedNumber<unsigned_long> *pJVar4;
  undefined4 *puVar5;
  JavascriptTypedNumber<long> *pJVar6;
  double dbl2;
  Type TVar7;
  double dbl1;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  switch(leftType) {
  case TypeIds_FirstNumberType:
    if (rightType != TypeIds_Number) {
      if (rightType != TypeIds_FirstNumberType) {
        return 0;
      }
      bVar2 = aLeft == aRight;
      goto LAB_00ab4403;
    }
    if ((ulong)aRight >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar2) goto LAB_00ab46ba;
      *puVar5 = 0;
    }
    dbl1 = (double)(int)aLeft;
    break;
  case TypeIds_Number:
    switch(rightType) {
    case TypeIds_FirstNumberType:
      if ((ulong)aLeft >> 0x32 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                    ,0xd4,"(Is(aValue))",
                                    "Ensure var is actually a \'JavascriptNumber\'");
        if (!bVar2) goto LAB_00ab46ba;
        *puVar5 = 0;
      }
      dbl1 = (double)((ulong)aLeft ^ 0xfffc000000000000);
      dbl2 = (double)(int)aRight;
      break;
    case TypeIds_Number:
      if ((ulong)aLeft >> 0x32 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                    ,0xd4,"(Is(aValue))",
                                    "Ensure var is actually a \'JavascriptNumber\'");
        if (!bVar2) goto LAB_00ab46ba;
        *puVar5 = 0;
      }
      if (aRight < (Var)0x4000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                    ,0xd4,"(Is(aValue))",
                                    "Ensure var is actually a \'JavascriptNumber\'");
        if (!bVar2) goto LAB_00ab46ba;
        *puVar5 = 0;
      }
      dbl1 = (double)((ulong)aLeft ^ 0xfffc000000000000);
      goto LAB_00ab44a3;
    case TypeIds_Int64Number:
      if ((ulong)aLeft >> 0x32 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                    ,0xd4,"(Is(aValue))",
                                    "Ensure var is actually a \'JavascriptNumber\'");
        if (!bVar2) goto LAB_00ab46ba;
        *puVar5 = 0;
      }
      dbl1 = (double)((ulong)aLeft ^ 0xfffc000000000000);
      pJVar6 = VarTo<Js::JavascriptTypedNumber<long>>(aRight);
      dbl2 = (double)pJVar6->m_value;
      break;
    case TypeIds_LastNumberType:
      if ((ulong)aLeft >> 0x32 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                    ,0xd4,"(Is(aValue))",
                                    "Ensure var is actually a \'JavascriptNumber\'");
        if (!bVar2) goto LAB_00ab46ba;
        *puVar5 = 0;
      }
      dbl1 = (double)((ulong)aLeft ^ 0xfffc000000000000);
      pJVar4 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight);
      auVar9._0_8_ = (double)CONCAT44(0x43300000,(int)pJVar4->m_value);
      auVar9._8_4_ = (int)(pJVar4->m_value >> 0x20);
      auVar9._12_4_ = 0x45300000;
      dbl2 = (auVar9._0_8_ - 4503599627370496.0) + (auVar9._8_8_ - 1.9342813113834067e+25);
      break;
    default:
      goto switchD_00ab4216_default;
    }
    goto LAB_00ab44ab;
  case TypeIds_Int64Number:
    if (rightType != TypeIds_Number) {
      if (rightType == TypeIds_LastNumberType) {
        pJVar4 = (JavascriptTypedNumber<unsigned_long> *)
                 UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
        goto LAB_00ab43ee;
      }
      if (rightType != TypeIds_Int64Number) {
        return 0;
      }
      pJVar4 = (JavascriptTypedNumber<unsigned_long> *)
               UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
LAB_00ab41eb:
      TVar7 = pJVar4->m_value;
      pJVar4 = (JavascriptTypedNumber<unsigned_long> *)
               UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight);
LAB_00ab43fa:
      bVar2 = TVar7 == pJVar4->m_value;
LAB_00ab4403:
      return (uint)bVar2;
    }
    pJVar6 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
    dbl1 = (double)pJVar6->m_value;
    if ((ulong)aRight >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar2) goto LAB_00ab46ba;
      *puVar5 = 0;
    }
    break;
  case TypeIds_LastNumberType:
    if (rightType != TypeIds_Number) {
      if (rightType != TypeIds_LastNumberType) {
        if (rightType != TypeIds_Int64Number) {
          return 0;
        }
        pJVar4 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
        goto LAB_00ab41eb;
      }
      pJVar4 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
LAB_00ab43ee:
      TVar7 = pJVar4->m_value;
      pJVar4 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight);
      goto LAB_00ab43fa;
    }
    pJVar4 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
    TVar7 = pJVar4->m_value;
    if ((ulong)aRight >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar2) goto LAB_00ab46ba;
      *puVar5 = 0;
    }
    auVar8._0_8_ = (double)CONCAT44(0x43300000,(int)TVar7);
    auVar8._8_4_ = (int)(TVar7 >> 0x20);
    auVar8._12_4_ = 0x45300000;
    dbl1 = (auVar8._0_8_ - 4503599627370496.0) + (auVar8._8_8_ - 1.9342813113834067e+25);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x39e,"(0 && \"Unreachable Code\")","0 && \"Unreachable Code\"");
    if (!bVar2) {
LAB_00ab46ba:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
switchD_00ab4216_default:
    return 0;
  }
LAB_00ab44a3:
  dbl2 = (double)((ulong)aRight ^ 0xfffc000000000000);
LAB_00ab44ab:
  BVar3 = FEqualDbl(dbl1,dbl2);
  return BVar3;
}

Assistant:

BOOL JavascriptOperators::StrictEqualNumberType(Var aLeft, Var aRight, TypeId leftType, TypeId rightType, ScriptContext *requestContext)
    {
        double dblLeft, dblRight;

        switch (leftType)
        {
        case TypeIds_Integer:
            switch (rightType)
            {
            case TypeIds_Integer:
                return aLeft == aRight;
                // we don't need to worry about int64: it cannot equal as we create
                // JavascriptInt64Number only in overflow scenarios.
            case TypeIds_Number:
                dblLeft = TaggedInt::ToDouble(aLeft);
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            }
            return FALSE;

        case TypeIds_Int64Number:
            switch (rightType)
            {
            case TypeIds_Int64Number:
            {
                __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
            }
            case TypeIds_UInt64Number:
            {
                __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptUInt64Number>(aRight)->GetValue();
                return ((unsigned __int64)leftValue == rightValue);
            }
            case TypeIds_Number:
                dblLeft = (double)UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            }
            return FALSE;

        case TypeIds_UInt64Number:
            switch (rightType)
            {
            case TypeIds_Int64Number:
            {
                unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                return (leftValue == (unsigned __int64)rightValue);
            }
            case TypeIds_UInt64Number:
            {
                unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptUInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
            }
            case TypeIds_Number:
                dblLeft = (double)UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            }
            return FALSE;

        case TypeIds_Number:
            switch (rightType)
            {
            case TypeIds_Integer:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = TaggedInt::ToDouble(aRight);
                goto CommonNumber;
            case TypeIds_Int64Number:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = (double)VarTo<JavascriptInt64Number>(aRight)->GetValue();
                goto CommonNumber;
            case TypeIds_UInt64Number:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = (double)UnsafeVarTo<JavascriptUInt64Number>(aRight)->GetValue();
                goto CommonNumber;
            case TypeIds_Number:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = JavascriptNumber::GetValue(aRight);
            CommonNumber:
                return FEqualDbl(dblLeft, dblRight);
            }
            return FALSE;
        }

        Assert(0 && "Unreachable Code");
        return FALSE;
    }